

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheGL.hpp
# Opt level: O2

bool __thiscall
Diligent::ShaderResourceCacheGL::IsTextureBound
          (ShaderResourceCacheGL *this,Uint32 CacheOffset,bool dbgIsTextureView)

{
  CachedResourceView *pCVar1;
  char (*Args_1) [48];
  string msg;
  
  Args_1 = (char (*) [48])0x0;
  if (CacheOffset < (uint)(((ulong)this->m_ImagesOffset - (ulong)this->m_TexturesOffset) / 0x18)) {
    pCVar1 = GetConstTexture(this,CacheOffset);
    if ((!dbgIsTextureView) && (pCVar1->pTexture != (TextureBaseGL *)0x0)) {
      FormatString<char[26],char[48]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"dbgIsTextureView || Texture.pTexture == nullptr",Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"IsTextureBound",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderResourceCacheGL.hpp"
                 ,0x108);
      std::__cxx11::string::~string((string *)&msg);
    }
    Args_1 = (char (*) [48])(ulong)((pCVar1->pView).m_pObject != (IDeviceObject *)0x0);
  }
  return SUB81(Args_1,0);
}

Assistant:

bool IsTextureBound(Uint32 CacheOffset, bool dbgIsTextureView) const
    {
        if (CacheOffset >= GetTextureCount())
            return false;

        const auto& Texture = GetConstTexture(CacheOffset);
        VERIFY_EXPR(dbgIsTextureView || Texture.pTexture == nullptr);
        return Texture.pView;
    }